

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O2

void al_register_event_source(ALLEGRO_EVENT_QUEUE *queue,ALLEGRO_EVENT_SOURCE *source)

{
  _Bool _Var1;
  undefined8 *puVar2;
  ALLEGRO_EVENT_SOURCE *local_18;
  
  local_18 = source;
  _Var1 = _al_vector_contains(&queue->sources,&local_18);
  if (!_Var1) {
    _al_event_source_on_registration_to_queue(local_18,queue);
    _al_mutex_lock(&queue->mutex);
    puVar2 = (undefined8 *)_al_vector_alloc_back(&queue->sources);
    *puVar2 = local_18;
    _al_mutex_unlock(&queue->mutex);
  }
  return;
}

Assistant:

void al_register_event_source(ALLEGRO_EVENT_QUEUE *queue,
   ALLEGRO_EVENT_SOURCE *source)
{
   ALLEGRO_EVENT_SOURCE **slot;
   ASSERT(queue);
   ASSERT(source);

   if (!_al_vector_contains(&queue->sources, &source)) {
      _al_event_source_on_registration_to_queue(source, queue);
      _al_mutex_lock(&queue->mutex);
      slot = _al_vector_alloc_back(&queue->sources);
      *slot = source;
      _al_mutex_unlock(&queue->mutex);
   }
}